

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::VariableWalkerBase::FindPropertyAddress
          (VariableWalkerBase *this,PropertyId propId,bool *isConst)

{
  DebuggerPropertyDisplayInfo *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Type *ppDVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  DebuggerPropertyDisplayInfo *pair;
  int i;
  bool *isConst_local;
  PropertyId propId_local;
  VariableWalkerBase *this_local;
  
  (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[4])();
  if (this->pMembersList !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    for (pair._4_4_ = 0;
        iVar3 = JsUtil::
                ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                ::Count(&this->pMembersList->
                         super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ), (int)pair._4_4_ < iVar3; pair._4_4_ = pair._4_4_ + 1) {
      ppDVar4 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pMembersList,pair._4_4_);
      this_00 = *ppDVar4;
      if (this_00 == (DebuggerPropertyDisplayInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x1c8,"(pair)","pair");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (this_00->propId == propId) {
        bVar2 = DebuggerPropertyDisplayInfo::IsConst(this_00);
        *isConst = bVar2;
        iVar3 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[5])
                          (this,(ulong)pair._4_4_);
        return (IDiagObjectAddress *)CONCAT44(extraout_var,iVar3);
      }
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress *VariableWalkerBase::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        PopulateMembers();
        if (pMembersList)
        {
            for (int i = 0; i < pMembersList->Count(); i++)
            {
                DebuggerPropertyDisplayInfo *pair = pMembersList->Item(i);
                Assert(pair);
                if (pair->propId == propId)
                {
                    isConst = pair->IsConst();
                    return GetObjectAddress(i);
                }
            }
        }
        return nullptr;
    }